

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::RNEMD::doRNEMD(RNEMD *this)

{
  bool bVar1;
  long *in_RDI;
  SelectionManager *this_00;
  SelectionManager reducedTempCommonB;
  SelectionManager reducedTempCommonA;
  SelectionManager tempCommonB;
  SelectionManager tempCommonA;
  RealType area;
  SelectionManager reducedCommonB;
  SelectionManager reducedCommonA;
  Snapshot *in_stack_fffffffffffff838;
  errorStruct *peVar2;
  SelectionManager *in_stack_fffffffffffff840;
  SelectionSet *in_stack_fffffffffffff848;
  Vector<double,_3U> *v1;
  SelectionManager *in_stack_fffffffffffff850;
  SelectionManager *in_stack_fffffffffffff860;
  SelectionManager *sman2;
  SelectionManager *in_stack_fffffffffffff868;
  SelectionManager *sman1;
  SelectionEvaluator *in_stack_fffffffffffff878;
  string *in_stack_fffffffffffff888;
  SelectionEvaluator *in_stack_fffffffffffff890;
  undefined1 local_750 [72];
  SelectionManager *in_stack_fffffffffffff8f8;
  RNEMD *in_stack_fffffffffffff938;
  undefined1 local_688 [696];
  SelectionManager *local_3d0;
  undefined1 local_3c8 [200];
  undefined1 local_300 [400];
  Vector<double,_3U> local_170 [8];
  
  if ((*(byte *)(in_RDI + 0x51) & 1) != 0) {
    *(int *)(in_RDI + 0x65) = (int)in_RDI[0x65] + 1;
    Snapshot::getHmat(in_stack_fffffffffffff838);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffff840,
               (SquareMatrix3<double> *)in_stack_fffffffffffff838);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x348455);
    SelectionEvaluator::loadScriptString(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x6b));
    if (bVar1) {
      in_stack_fffffffffffff890 = (SelectionEvaluator *)(in_RDI + 0x115);
      SelectionEvaluator::evaluate(in_stack_fffffffffffff878);
      SelectionManager::setSelectionSet(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      SelectionSet::~SelectionSet((SelectionSet *)0x3484d1);
    }
    SelectionEvaluator::loadScriptString(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x136));
    if (bVar1) {
      in_stack_fffffffffffff888 = (string *)&stack0xffffffffffffff70;
      SelectionEvaluator::evaluate(in_stack_fffffffffffff878);
      SelectionManager::setSelectionSet(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      SelectionSet::~SelectionSet((SelectionSet *)0x34859b);
    }
    SelectionEvaluator::loadScriptString(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1e0));
    if (bVar1) {
      SelectionEvaluator::evaluate((SelectionEvaluator *)&stack0xffffffffffffff58);
      SelectionManager::setSelectionSet(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      SelectionSet::~SelectionSet((SelectionSet *)0x34863f);
    }
    v1 = local_170;
    operator&(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
    sman2 = (SelectionManager *)(in_RDI + 0x14);
    SelectionManager::operator=
              (in_stack_fffffffffffff840,(SelectionManager *)in_stack_fffffffffffff838);
    SelectionManager::~SelectionManager(in_stack_fffffffffffff840);
    operator&(in_stack_fffffffffffff868,sman2);
    sman1 = (SelectionManager *)(in_RDI + 0x2d);
    SelectionManager::operator=
              (in_stack_fffffffffffff840,(SelectionManager *)in_stack_fffffffffffff838);
    SelectionManager::~SelectionManager(in_stack_fffffffffffff840);
    SelectionManager::removeAtomsInRigidBodies(in_stack_fffffffffffff8f8);
    SelectionManager::removeAtomsInRigidBodies(in_stack_fffffffffffff8f8);
    this_00 = (SelectionManager *)getDefaultDividingArea(in_stack_fffffffffffff938);
    in_RDI[0x55] = (long)((double)in_RDI[0x38e] * (double)in_RDI[0x396] * (double)this_00);
    local_3d0 = this_00;
    OpenMD::operator*(v1,(double)this_00);
    OpenMD::operator*(v1,(double)this_00);
    Vector3<double>::operator=((Vector3<double> *)v1,(Vector<double,_3U> *)this_00);
    OpenMD::operator*(v1,(double)this_00);
    OpenMD::operator*(v1,(double)this_00);
    Vector3<double>::operator=((Vector3<double> *)v1,(Vector<double,_3U> *)this_00);
    in_RDI[0x56] = (long)((double)in_RDI[0x38f] * (double)in_RDI[0x396] * (double)local_3d0);
    if (1.0 < ABS((double)in_RDI[0x56])) {
      peVar2 = &painCave;
      snprintf(painCave.errMsg,2000,
               "RNEMD: The current particleFlux,\n\t\t%f\n\thas resulted in a target particle exchange of %f.\n\tThis is equivalent to moving more than one particle\n\tduring each exchange.  Please reduce your particleFlux.\n"
               ,in_RDI[0x38f],(int)in_RDI[0x56]);
      peVar2->isFatal = 1;
      peVar2->severity = 1;
      simError();
    }
    if (((*(int *)((long)in_RDI + 0x244) == 0xb) || (*(int *)((long)in_RDI + 0x244) == 0xc)) ||
       (*(int *)((long)in_RDI + 0x244) == 0xd)) {
      operator&(sman1,sman2);
      operator&(sman1,sman2);
      SelectionManager::removeAtomsInRigidBodies(in_stack_fffffffffffff8f8);
      SelectionManager::removeAtomsInRigidBodies(in_stack_fffffffffffff8f8);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_688,local_750);
      SelectionManager::~SelectionManager(this_00);
      SelectionManager::~SelectionManager(this_00);
      SelectionManager::~SelectionManager(this_00);
      SelectionManager::~SelectionManager(this_00);
    }
    else {
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_300,local_3c8);
    }
    SelectionManager::~SelectionManager(this_00);
    SelectionManager::~SelectionManager(this_00);
  }
  return;
}

Assistant:

void RNEMD::doRNEMD() {
    if (!doRNEMD_) return;
    trialCount_++;
    hmat_ = currentSnap_->getHmat();

    // dynamic object evaluators:
    evaluator_.loadScriptString(rnemdObjectSelection_);
    if (evaluator_.isDynamic()) seleMan_.setSelectionSet(evaluator_.evaluate());

    evaluatorA_.loadScriptString(selectionA_);
    if (evaluatorA_.isDynamic())
      seleManA_.setSelectionSet(evaluatorA_.evaluate());

    evaluatorB_.loadScriptString(selectionB_);
    if (evaluatorB_.isDynamic())
      seleManB_.setSelectionSet(evaluatorB_.evaluate());

    commonA_ = seleManA_ & seleMan_;
    commonB_ = seleManB_ & seleMan_;

    auto reducedCommonA = commonA_.removeAtomsInRigidBodies();
    auto reducedCommonB = commonB_.removeAtomsInRigidBodies();

    // Target exchange quantities (in each exchange) = flux * dividingArea *
    // dt flux = target flux dividingArea = smallest dividing surface between
    // the two regions dt = exchange time interval

    RealType area = getDefaultDividingArea();

    kineticTarget_         = kineticFlux_ * exchangeTime_ * area;
    momentumTarget_        = momentumFluxVector_ * exchangeTime_ * area;
    angularMomentumTarget_ = angularMomentumFluxVector_ * exchangeTime_ * area;
    particleTarget_        = particleFlux_ * exchangeTime_ * area;

    if (std::fabs(particleTarget_) > 1.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current particleFlux,\n"
               "\t\t%f\n"
               "\thas resulted in a target particle exchange of %f.\n"
               "\tThis is equivalent to moving more than one particle\n"
               "\tduring each exchange.  Please reduce your particleFlux.\n",
               particleFlux_, particleTarget_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (rnemdFluxType_ == rnemdParticle || rnemdFluxType_ == rnemdParticleKE ||
        rnemdFluxType_ == rnemdCurrentDensity) {
      SelectionManager tempCommonA = seleManA_ & outputSeleMan_;
      SelectionManager tempCommonB = seleManB_ & outputSeleMan_;

      auto reducedTempCommonA = tempCommonA.removeAtomsInRigidBodies();
      auto reducedTempCommonB = tempCommonB.removeAtomsInRigidBodies();

      this->doRNEMDImpl(reducedTempCommonA, reducedTempCommonB);
    } else {
      this->doRNEMDImpl(reducedCommonA, reducedCommonB);
    }
  }